

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alchitry_Loader.cpp
# Opt level: O3

void write_to_file(string *file,PFT_PROGRAM_DATA ftData)

{
  ofstream output_file;
  CONFIG_DATA config;
  long local_298;
  filebuf local_290 [240];
  ios_base local_1a0 [264];
  CONFIG_DATA local_98;
  
  std::ofstream::ofstream(&local_298,(string *)file,_S_bin);
  ft_to_config(&local_98,ftData);
  std::ostream::write((char *)&local_298,(long)&local_98);
  std::ostream::write((char *)&local_298,0x159560);
  std::ostream::write((char *)&local_298,0x159580);
  std::ostream::write((char *)&local_298,0x159590);
  std::ostream::write((char *)&local_298,0x1595d0);
  std::ofstream::close();
  local_298 = _VTT;
  *(undefined8 *)(local_290 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_290);
  std::ios_base::~ios_base(local_1a0);
  return;
}

Assistant:

void write_to_file(const string& file, PFT_PROGRAM_DATA ftData) {
    ofstream output_file(file, ios::binary);
    CONFIG_DATA config;
    ft_to_config(&config, ftData);
    output_file.write((char *) &config, sizeof(CONFIG_DATA));
    output_file.write(ManufacturerBuf, sizeof(ManufacturerBuf));
    output_file.write(ManufacturerIdBuf, sizeof(ManufacturerIdBuf));
    output_file.write(DescriptionBuf, sizeof(DescriptionBuf));
    output_file.write(SerialNumberBuf, sizeof(SerialNumberBuf));
    output_file.close();
}